

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QMovableArrayOps<QVariant>::erase
          (QMovableArrayOps<QVariant> *this,QVariant *b,qsizetype n)

{
  QVariant *__src;
  QVariant *pQVar1;
  long lVar2;
  QVariant *pQVar3;
  
  lVar2 = n * 0x20;
  __src = b + n;
  pQVar3 = b;
  if (n != 0) {
    do {
      ::QVariant::~QVariant(pQVar3);
      lVar2 = lVar2 + -0x20;
      pQVar3 = pQVar3 + 1;
    } while (lVar2 != 0);
  }
  pQVar3 = (this->super_QGenericArrayOps<QVariant>).super_QArrayDataPointer<QVariant>.ptr;
  lVar2 = (this->super_QGenericArrayOps<QVariant>).super_QArrayDataPointer<QVariant>.size;
  pQVar1 = pQVar3 + lVar2;
  if (__src == pQVar1 || pQVar3 != b) {
    if (__src != pQVar1) {
      memmove(b,__src,(long)pQVar1 - (long)__src);
      lVar2 = (this->super_QGenericArrayOps<QVariant>).super_QArrayDataPointer<QVariant>.size;
    }
  }
  else {
    (this->super_QGenericArrayOps<QVariant>).super_QArrayDataPointer<QVariant>.ptr = __src;
  }
  (this->super_QGenericArrayOps<QVariant>).super_QArrayDataPointer<QVariant>.size = lVar2 - n;
  return;
}

Assistant:

void erase(T *b, qsizetype n)
    {
        T *e = b + n;

        Q_ASSERT(this->isMutable());
        Q_ASSERT(b < e);
        Q_ASSERT(b >= this->begin() && b < this->end());
        Q_ASSERT(e > this->begin() && e <= this->end());

        // Comply with std::vector::erase(): erased elements and all after them
        // are invalidated. However, erasing from the beginning effectively
        // means that all iterators are invalidated. We can use this freedom to
        // erase by moving towards the end.

        std::destroy(b, e);
        if (b == this->begin() && e != this->end()) {
            this->ptr = e;
        } else if (e != this->end()) {
            memmove(static_cast<void *>(b), static_cast<const void *>(e), (static_cast<const T *>(this->end()) - e)*sizeof(T));
        }
        this->size -= n;
    }